

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow *window_00;
  float fVar1;
  float fVar2;
  float target_pos_x;
  float spacing_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  float center_x_ratio_local;
  
  window_00 = GImGui->CurrentWindow;
  fVar1 = ImMax<float>((window_00->WindowPadding).x,(GImGui->Style).ItemSpacing.x);
  fVar2 = ImLerp<float>((window_00->DC).LastItemRect.Min.x - fVar1,
                        (window_00->DC).LastItemRect.Max.x + fVar1,center_x_ratio);
  SetScrollFromPosX(window_00,fVar2 - (window_00->Pos).x,center_x_ratio);
  fVar1 = ImMax<float>(0.0,(window_00->WindowPadding).x - fVar1);
  (window_00->ScrollTargetEdgeSnapDist).x = fVar1;
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = ImMax(window->WindowPadding.x, g.Style.ItemSpacing.x);
    float target_pos_x = ImLerp(window->DC.LastItemRect.Min.x - spacing_x, window->DC.LastItemRect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}